

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O0

void __thiscall
iDynTree::InverseKinematics::getReducedSolution
          (InverseKinematics *this,Transform *baseTransformSolution,VectorDynSize *shapeSolution)

{
  missingIpoptErrorReport();
  return;
}

Assistant:

void InverseKinematics::getReducedSolution(iDynTree::Transform & baseTransformSolution,
                                               iDynTree::VectorDynSize & shapeSolution)
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        baseTransformSolution = IK_PIMPL(m_pimpl)->m_baseResults;
        assert(shapeSolution.size() == IK_PIMPL(m_pimpl)->m_reducedVariablesInfo.modelJointsToOptimisedJoints.size());
        for (size_t i = 0; i < shapeSolution.size(); ++i) {
            shapeSolution(i) = IK_PIMPL(m_pimpl)->m_jointsResults(IK_PIMPL(m_pimpl)->m_reducedVariablesInfo.modelJointsToOptimisedJoints[i]);
        }
        return;
#else
        missingIpoptErrorReport();
#endif
    }